

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

int vector_setup(Vector *vector,size_t capacity,size_t element_size)

{
  void *pvVar1;
  size_t sVar2;
  
  if (vector != (Vector *)0x0) {
    sVar2 = capacity + (capacity == 0);
    vector->size = 0;
    vector->capacity = sVar2;
    vector->element_size = element_size;
    pvVar1 = malloc(sVar2 * element_size);
    vector->data = pvVar1;
    return -(uint)(pvVar1 == (void *)0x0);
  }
  __assert_fail("vector != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/vector.c"
                ,10,"int vector_setup(Vector *, size_t, size_t)");
}

Assistant:

int vector_setup(Vector* vector, size_t capacity, size_t element_size) {
	assert(vector != NULL);

	if (vector == NULL) return VECTOR_ERROR;

	vector->size = 0;
	vector->capacity = MAX(VECTOR_MINIMUM_CAPACITY, capacity);
	vector->element_size = element_size;
	vector->data = malloc(vector->capacity * element_size);

	return vector->data == NULL ? VECTOR_ERROR : VECTOR_SUCCESS;
}